

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long *in_RSI;
  long in_RDI;
  int absvalues [64];
  JBLOCKROW block;
  int *natural_order;
  int Al;
  int Se;
  uint BR;
  char *BR_buffer;
  int EOB;
  int k;
  int r;
  int temp;
  huff_entropy_ptr entropy;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  int in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  huff_entropy_ptr in_stack_fffffffffffffeb0;
  uint local_34;
  long local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  lVar4 = *(long *)(in_RDI + 0x230);
  *(undefined8 *)(lVar4 + 200) = **(undefined8 **)(in_RDI + 0x28);
  *(undefined8 *)(lVar4 + 0xd0) = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8);
  if ((*(int *)(in_RDI + 0x13c) != 0) && (*(int *)(lVar4 + 0x38) == 0)) {
    emit_restart_e((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c);
  }
  iVar1 = *(int *)(in_RDI + 0x1d0);
  uVar2 = *(undefined4 *)(in_RDI + 0x1d8);
  lVar5 = *(long *)(in_RDI + 0x1e0);
  lVar6 = *in_RSI;
  local_28 = 0;
  for (local_24 = *(int *)(in_RDI + 0x1cc); local_24 <= iVar1; local_24 = local_24 + 1) {
    local_1c = (int)*(short *)(lVar6 + (long)*(int *)(lVar5 + (long)local_24 * 4) * 2);
    if (local_1c < 0) {
      local_1c = -local_1c;
    }
    local_1c = local_1c >> ((byte)uVar2 & 0x1f);
    *(int *)(&stack0xfffffffffffffea8 + (long)local_24 * 4) = local_1c;
    if (local_1c == 1) {
      local_28 = local_24;
    }
  }
  local_20 = 0;
  local_34 = 0;
  local_30 = *(long *)(lVar4 + 0xf0) + (ulong)*(uint *)(lVar4 + 0xe8);
  for (local_24 = *(int *)(in_RDI + 0x1cc); local_24 <= iVar1; local_24 = local_24 + 1) {
    iVar3 = *(int *)(&stack0xfffffffffffffea8 + (long)local_24 * 4);
    if (iVar3 == 0) {
      local_20 = local_20 + 1;
    }
    else {
      while (in_stack_fffffffffffffea7 = 0xf < local_20 && local_24 <= local_28,
            0xf < local_20 && local_24 <= local_28) {
        emit_eobrun((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0))
        ;
        emit_ac_symbol((huff_entropy_ptr)
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        local_20 = local_20 + -0x10;
        emit_buffered_bits((huff_entropy_ptr)
                           CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                           (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0);
        local_30 = *(long *)(lVar4 + 0xf0);
        local_34 = 0;
      }
      if (iVar3 < 2) {
        emit_eobrun((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0))
        ;
        emit_ac_symbol((huff_entropy_ptr)
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        emit_bits_e(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
        emit_buffered_bits((huff_entropy_ptr)
                           CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                           (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0);
        local_30 = *(long *)(lVar4 + 0xf0);
        local_34 = 0;
        local_20 = 0;
      }
      else {
        *(byte *)(local_30 + (ulong)local_34) = (byte)iVar3 & 1;
        local_34 = local_34 + 1;
      }
    }
  }
  if ((0 < local_20) || (local_34 != 0)) {
    *(int *)(lVar4 + 0xe4) = *(int *)(lVar4 + 0xe4) + 1;
    *(uint *)(lVar4 + 0xe8) = local_34 + *(int *)(lVar4 + 0xe8);
    if ((*(int *)(lVar4 + 0xe4) == 0x7fff) || (0x3a9 < *(uint *)(lVar4 + 0xe8))) {
      emit_eobrun((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
  }
  **(undefined8 **)(in_RDI + 0x28) = *(undefined8 *)(lVar4 + 200);
  *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8) = *(undefined8 *)(lVar4 + 0xd0);
  if (*(int *)(in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar4 + 0x38) == 0) {
      *(undefined4 *)(lVar4 + 0x38) = *(undefined4 *)(in_RDI + 0x13c);
      *(int *)(lVar4 + 0x3c) = *(int *)(lVar4 + 0x3c) + 1;
      *(uint *)(lVar4 + 0x3c) = *(uint *)(lVar4 + 0x3c) & 7;
    }
    *(int *)(lVar4 + 0x38) = *(int *)(lVar4 + 0x38) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);	/* EOB decision */
    for (;;) {
      if ((v = (*block)[natural_order[k]]) >= 0) {
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 0);
	  }
	  break;
	}
      } else {
	v = -v;
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 1);
	  }
	  break;
	}
      }
      arith_encode(cinfo, st + 1, 0); st += 3; k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}